

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::addSubDeviceInfo
          (CLIntercept *this,cl_device_id parentDevice,cl_device_id *devices,cl_uint numSubDevices)

{
  map<_cl_device_id_*,_CLIntercept::SSubDeviceInfo,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_CLIntercept::SSubDeviceInfo>_>_>
  *this_00;
  bool bVar1;
  uint in_ECX;
  uint uVar2;
  long in_RDX;
  cl_device_id in_RSI;
  CLIntercept *in_RDI;
  float __x;
  SSubDeviceInfo *subDeviceInfo;
  cl_device_id device;
  lock_guard<std::mutex> lock;
  map<_cl_device_id_*,_CLIntercept::SDeviceInfo,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_CLIntercept::SDeviceInfo>_>_>
  *in_stack_ffffffffffffff88;
  lock_guard<std::mutex> *in_stack_ffffffffffffff90;
  _Self local_58;
  _Self local_50 [3];
  mapped_type *in_stack_ffffffffffffffc8;
  uint local_1c;
  
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_ffffffffffffff90,(mutex_type *)in_stack_ffffffffffffff88);
  local_1c = in_ECX;
  while (uVar2 = local_1c - 1, local_1c != 0) {
    this_00 = *(map<_cl_device_id_*,_CLIntercept::SSubDeviceInfo,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_CLIntercept::SSubDeviceInfo>_>_>
                **)(in_RDX + (ulong)uVar2 * 8);
    local_1c = uVar2;
    if (this_00 !=
        (map<_cl_device_id_*,_CLIntercept::SSubDeviceInfo,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_CLIntercept::SSubDeviceInfo>_>_>
         *)0x0) {
      in_stack_ffffffffffffffc8 =
           std::
           map<_cl_device_id_*,_CLIntercept::SSubDeviceInfo,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_CLIntercept::SSubDeviceInfo>_>_>
           ::operator[](this_00,&in_stack_ffffffffffffffc8->ParentDevice);
      in_stack_ffffffffffffffc8->ParentDevice = in_RSI;
      in_stack_ffffffffffffffc8->SubDeviceIndex = uVar2;
      local_50[0]._M_node =
           (_Base_ptr)
           std::
           map<_cl_device_id_*,_CLIntercept::SDeviceInfo,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_CLIntercept::SDeviceInfo>_>_>
           ::find(in_stack_ffffffffffffff88,(key_type *)0x209129);
      local_58._M_node =
           (_Base_ptr)
           std::
           map<_cl_device_id_*,_CLIntercept::SDeviceInfo,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_CLIntercept::SDeviceInfo>_>_>
           ::end(in_stack_ffffffffffffff88);
      bVar1 = std::operator!=(local_50,&local_58);
      if (bVar1) {
        logf(in_RDI,__x);
      }
    }
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2091ac);
  return;
}

Assistant:

void CLIntercept::addSubDeviceInfo(
    const cl_device_id parentDevice,
    const cl_device_id* devices,
    cl_uint numSubDevices )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    while( numSubDevices-- )
    {
        cl_device_id    device = devices[ numSubDevices ];
        if( device )
        {
            SSubDeviceInfo& subDeviceInfo = m_SubDeviceInfoMap[ device ];

            subDeviceInfo.ParentDevice = parentDevice;
            subDeviceInfo.SubDeviceIndex = numSubDevices;

            // Currently, information about a device is assumed to be
            // invariant, though for sub-device handles the information
            // about a device can change if sub-device handles are recycled.
            // Since this is expected to occur rarely, for now simply log a
            // warning if this occurs.
            if( m_DeviceInfoMap.find(device) != m_DeviceInfoMap.end() )
            {
                logf( "Warning: found a recycled sub-device handle %p!\n",
                    device );
            }
        }
    }
}